

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

bool jsonip::parser::plus_<jsonip::parser::digit_>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  char cVar1;
  long lVar2;
  istream *piVar3;
  
  piVar3 = state->reader_->in_;
  if ((*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) ||
     (cVar1 = std::istream::peek(), 9 < (byte)(cVar1 - 0x30U))) {
    return false;
  }
  piVar3 = state->reader_->in_;
  lVar2 = *(long *)(*(long *)piVar3 + -0x18);
  while( true ) {
    if (*(int *)(piVar3 + lVar2 + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) break;
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    std::istream::get();
    piVar3 = state->reader_->in_;
    if (*(int *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20) != 0) {
      return true;
    }
    cVar1 = std::istream::peek();
    if (9 < (byte)(cVar1 - 0x30U)) {
      return true;
    }
    piVar3 = state->reader_->in_;
    lVar2 = *(long *)(*(long *)piVar3 + -0x18);
  }
  return true;
}

Assistant:

static inline bool match(S& state)
        {
            if (!C0::match(state)) return false;
            // Note: yes, I unroll this loop intentionally
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }